

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrRenderer.cpp
# Opt level: O1

void rr::(anonymous_namespace)::
     drawBasicPrimitives<std::vector<rr::pa::Point,std::allocator<rr::pa::Point>>>
               (RenderState *state,RenderTarget *renderTarget,Program *program,
               vector<rr::pa::Point,_std::allocator<rr::pa::Point>_> *primList,
               VertexPacketAllocator *vpalloc)

{
  FragmentPacket *pFVar1;
  float fVar2;
  int iVar3;
  pointer pPVar4;
  pointer pFVar5;
  pointer pFVar6;
  VertexPacket *pVVar7;
  pointer pGVar8;
  pointer pGVar9;
  pointer pGVar10;
  pointer pFVar11;
  pointer pFVar12;
  pointer pFVar13;
  pointer outputArray_;
  uint uVar14;
  pointer pPVar15;
  FragmentPacket *fragmentPackets;
  pointer pPVar16;
  float *depthValues;
  int iVar17;
  int iVar18;
  pointer fragmentDepths_;
  int iVar19;
  int iVar20;
  ulong uVar21;
  uint uVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  FaceType in_stack_fffffffffffffc68;
  int numRasterizedPackets;
  pointer local_388;
  pointer local_380;
  int local_374;
  pointer local_370;
  RenderTarget *local_368;
  vector<rr::Fragment,_std::allocator<rr::Fragment>_> shadedFragments;
  RasterizationInternalBuffers buffers;
  vector<rr::GenericVec4,_std::allocator<rr::GenericVec4>_> shaderOutputs;
  IVec4 renderTargetRect;
  Vec4 w2;
  Vec4 w0;
  vector<float,_std::allocator<float>_> local_288;
  Vec4 w3;
  Vec4 w1;
  vector<rr::pa::Point,_std::allocator<rr::pa::Point>_> visiblePoints;
  FragmentShadingContext shadingContext;
  TriangleRasterizer rasterizer2;
  
  visiblePoints.super__Vector_base<rr::pa::Point,_std::allocator<rr::pa::Point>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  visiblePoints.super__Vector_base<rr::pa::Point,_std::allocator<rr::pa::Point>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  visiblePoints.super__Vector_base<rr::pa::Point,_std::allocator<rr::pa::Point>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_368 = renderTarget;
  if ((state->fragOps).depthClampEnabled == false) {
    pPVar15 = (primList->super__Vector_base<rr::pa::Point,_std::allocator<rr::pa::Point>_>)._M_impl.
              super__Vector_impl_data._M_start;
    pPVar16 = (primList->super__Vector_base<rr::pa::Point,_std::allocator<rr::pa::Point>_>)._M_impl.
              super__Vector_impl_data._M_finish;
    if (pPVar16 != pPVar15) {
      uVar21 = 0;
      do {
        fVar24 = ((pPVar15[uVar21].v0)->position).m_data[2];
        fVar2 = ((pPVar15[uVar21].v0)->position).m_data[3];
        if ((-fVar2 <= fVar24) && (fVar24 <= fVar2)) {
          rasterizer2.m_viewport.m_data._0_8_ = pPVar15[uVar21].v0;
          std::vector<rr::pa::Point,_std::allocator<rr::pa::Point>_>::emplace_back<rr::pa::Point>
                    (&visiblePoints,(Point *)&rasterizer2);
        }
        uVar21 = uVar21 + 1;
        pPVar15 = (primList->super__Vector_base<rr::pa::Point,_std::allocator<rr::pa::Point>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        pPVar16 = (primList->super__Vector_base<rr::pa::Point,_std::allocator<rr::pa::Point>_>).
                  _M_impl.super__Vector_impl_data._M_finish;
      } while (uVar21 < (ulong)((long)pPVar16 - (long)pPVar15 >> 3));
    }
    pPVar4 = (primList->super__Vector_base<rr::pa::Point,_std::allocator<rr::pa::Point>_>)._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    (primList->super__Vector_base<rr::pa::Point,_std::allocator<rr::pa::Point>_>)._M_impl.
    super__Vector_impl_data._M_start =
         visiblePoints.super__Vector_base<rr::pa::Point,_std::allocator<rr::pa::Point>_>._M_impl.
         super__Vector_impl_data._M_start;
    (primList->super__Vector_base<rr::pa::Point,_std::allocator<rr::pa::Point>_>)._M_impl.
    super__Vector_impl_data._M_finish =
         visiblePoints.super__Vector_base<rr::pa::Point,_std::allocator<rr::pa::Point>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (primList->super__Vector_base<rr::pa::Point,_std::allocator<rr::pa::Point>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         visiblePoints.super__Vector_base<rr::pa::Point,_std::allocator<rr::pa::Point>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    visiblePoints.super__Vector_base<rr::pa::Point,_std::allocator<rr::pa::Point>_>._M_impl.
    super__Vector_impl_data._M_start = pPVar15;
    visiblePoints.super__Vector_base<rr::pa::Point,_std::allocator<rr::pa::Point>_>._M_impl.
    super__Vector_impl_data._M_finish = pPVar16;
    visiblePoints.super__Vector_base<rr::pa::Point,_std::allocator<rr::pa::Point>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = pPVar4;
  }
  if (visiblePoints.super__Vector_base<rr::pa::Point,_std::allocator<rr::pa::Point>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(visiblePoints.super__Vector_base<rr::pa::Point,_std::allocator<rr::pa::Point>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)visiblePoints.
                          super__Vector_base<rr::pa::Point,_std::allocator<rr::pa::Point>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)visiblePoints.
                          super__Vector_base<rr::pa::Point,_std::allocator<rr::pa::Point>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  for (pPVar15 = (primList->super__Vector_base<rr::pa::Point,_std::allocator<rr::pa::Point>_>).
                 _M_impl.super__Vector_impl_data._M_start;
      pPVar15 !=
      (primList->super__Vector_base<rr::pa::Point,_std::allocator<rr::pa::Point>_>)._M_impl.
      super__Vector_impl_data._M_finish; pPVar15 = pPVar15 + 1) {
    anon_unknown_19::transformVertexClipCoordsToWindowCoords(state,pPVar15->v0);
  }
  iVar3 = *(int *)&local_368->field_0x8;
  pFVar5 = (program->fragmentShader->m_outputs).
           super__Vector_base<rr::FragmentOutputInfo,_std::allocator<rr::FragmentOutputInfo>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  pFVar6 = (program->fragmentShader->m_outputs).
           super__Vector_base<rr::FragmentOutputInfo,_std::allocator<rr::FragmentOutputInfo>_>.
           _M_impl.super__Vector_impl_data._M_start;
  iVar20 = (state->viewport).rect.left;
  iVar19 = (state->viewport).rect.bottom;
  iVar17 = (state->viewport).rect.width + iVar20;
  iVar18 = (state->viewport).rect.height + iVar19;
  MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess
            ((MultisampleConstPixelBufferAccess *)&visiblePoints,
             (MultisamplePixelBufferAccess *)local_368);
  if (iVar20 < 1) {
    iVar20 = 0;
  }
  if (iVar19 < 1) {
    iVar19 = 0;
  }
  if (visiblePoints.super__Vector_base<rr::pa::Point,_std::allocator<rr::pa::Point>_>._M_impl.
      super__Vector_impl_data._M_finish._4_4_ <= iVar17) {
    iVar17 = visiblePoints.super__Vector_base<rr::pa::Point,_std::allocator<rr::pa::Point>_>._M_impl
             .super__Vector_impl_data._M_finish._4_4_;
  }
  if ((int)visiblePoints.super__Vector_base<rr::pa::Point,_std::allocator<rr::pa::Point>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage <= iVar18) {
    iVar18 = (int)visiblePoints.super__Vector_base<rr::pa::Point,_std::allocator<rr::pa::Point>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  renderTargetRect.m_data[2] = iVar17 - iVar20;
  renderTargetRect.m_data[3] = iVar18 - iVar19;
  renderTargetRect.m_data[0] = iVar20;
  renderTargetRect.m_data[1] = iVar19;
  fragmentPackets = (FragmentPacket *)operator_new(0x2000);
  pFVar1 = fragmentPackets + 0x80;
  memset(fragmentPackets,0,0x2000);
  std::vector<rr::GenericVec4,_std::allocator<rr::GenericVec4>_>::vector
            (&shaderOutputs,((long)pFVar5 - (long)pFVar6) * 0x40000000 >> 0x17,
             (allocator_type *)&visiblePoints);
  std::vector<rr::Fragment,_std::allocator<rr::Fragment>_>::vector
            (&shadedFragments,0x200,(allocator_type *)&visiblePoints);
  local_288.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_288.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (float *)0x0;
  local_288.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  buffers.shadedFragments.super__Vector_base<rr::Fragment,_std::allocator<rr::Fragment>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  buffers.shadedFragments.super__Vector_base<rr::Fragment,_std::allocator<rr::Fragment>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  buffers.shadedFragments.super__Vector_base<rr::Fragment,_std::allocator<rr::Fragment>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  buffers.shaderOutputs.super__Vector_base<rr::GenericVec4,_std::allocator<rr::GenericVec4>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  buffers.shaderOutputs.super__Vector_base<rr::GenericVec4,_std::allocator<rr::GenericVec4>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  buffers.fragmentPackets.
  super__Vector_base<rr::FragmentPacket,_std::allocator<rr::FragmentPacket>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  buffers.shaderOutputs.super__Vector_base<rr::GenericVec4,_std::allocator<rr::GenericVec4>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  buffers.fragmentPackets.
  super__Vector_base<rr::FragmentPacket,_std::allocator<rr::FragmentPacket>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  buffers.fragmentPackets.
  super__Vector_base<rr::FragmentPacket,_std::allocator<rr::FragmentPacket>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess
            ((MultisampleConstPixelBufferAccess *)&visiblePoints,&local_368->m_depthBuffer);
  if ((((int)visiblePoints.super__Vector_base<rr::pa::Point,_std::allocator<rr::pa::Point>_>._M_impl
             .super__Vector_impl_data._M_finish == 0) ||
      (visiblePoints.super__Vector_base<rr::pa::Point,_std::allocator<rr::pa::Point>_>._M_impl.
       super__Vector_impl_data._M_finish._4_4_ == 0)) ||
     ((int)visiblePoints.super__Vector_base<rr::pa::Point,_std::allocator<rr::pa::Point>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage == 0)) {
    fragmentDepths_ = (float *)0x0;
  }
  else {
    std::vector<float,_std::allocator<float>_>::resize(&local_288,(long)iVar3 << 9);
    fragmentDepths_ =
         local_288.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
         ._M_start;
  }
  outputArray_ = shaderOutputs.super__Vector_base<rr::GenericVec4,_std::allocator<rr::GenericVec4>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  pFVar13 = buffers.shadedFragments.super__Vector_base<rr::Fragment,_std::allocator<rr::Fragment>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage;
  pFVar12 = buffers.shadedFragments.super__Vector_base<rr::Fragment,_std::allocator<rr::Fragment>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  pFVar11 = buffers.shadedFragments.super__Vector_base<rr::Fragment,_std::allocator<rr::Fragment>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pGVar10 = buffers.shaderOutputs.
            super__Vector_base<rr::GenericVec4,_std::allocator<rr::GenericVec4>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  pGVar9 = buffers.shaderOutputs.
           super__Vector_base<rr::GenericVec4,_std::allocator<rr::GenericVec4>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pGVar8 = buffers.shaderOutputs.
           super__Vector_base<rr::GenericVec4,_std::allocator<rr::GenericVec4>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_380 = buffers.fragmentPackets.
              super__Vector_base<rr::FragmentPacket,_std::allocator<rr::FragmentPacket>_>._M_impl.
              super__Vector_impl_data._M_start;
  local_388 = buffers.fragmentPackets.
              super__Vector_base<rr::FragmentPacket,_std::allocator<rr::FragmentPacket>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
  buffers.shaderOutputs.super__Vector_base<rr::GenericVec4,_std::allocator<rr::GenericVec4>_>.
  _M_impl.super__Vector_impl_data._M_start =
       shaderOutputs.super__Vector_base<rr::GenericVec4,_std::allocator<rr::GenericVec4>_>._M_impl.
       super__Vector_impl_data._M_start;
  buffers.shaderOutputs.super__Vector_base<rr::GenericVec4,_std::allocator<rr::GenericVec4>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       shaderOutputs.super__Vector_base<rr::GenericVec4,_std::allocator<rr::GenericVec4>_>._M_impl.
       super__Vector_impl_data._M_finish;
  buffers.shaderOutputs.super__Vector_base<rr::GenericVec4,_std::allocator<rr::GenericVec4>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       shaderOutputs.super__Vector_base<rr::GenericVec4,_std::allocator<rr::GenericVec4>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  shaderOutputs.super__Vector_base<rr::GenericVec4,_std::allocator<rr::GenericVec4>_>._M_impl.
  super__Vector_impl_data._M_start = pGVar8;
  shaderOutputs.super__Vector_base<rr::GenericVec4,_std::allocator<rr::GenericVec4>_>._M_impl.
  super__Vector_impl_data._M_finish = pGVar9;
  shaderOutputs.super__Vector_base<rr::GenericVec4,_std::allocator<rr::GenericVec4>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pGVar10;
  buffers.shadedFragments.super__Vector_base<rr::Fragment,_std::allocator<rr::Fragment>_>._M_impl.
  super__Vector_impl_data._M_start =
       shadedFragments.super__Vector_base<rr::Fragment,_std::allocator<rr::Fragment>_>._M_impl.
       super__Vector_impl_data._M_start;
  buffers.shadedFragments.super__Vector_base<rr::Fragment,_std::allocator<rr::Fragment>_>._M_impl.
  super__Vector_impl_data._M_finish =
       shadedFragments.super__Vector_base<rr::Fragment,_std::allocator<rr::Fragment>_>._M_impl.
       super__Vector_impl_data._M_finish;
  buffers.shadedFragments.super__Vector_base<rr::Fragment,_std::allocator<rr::Fragment>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       shadedFragments.super__Vector_base<rr::Fragment,_std::allocator<rr::Fragment>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  shadedFragments.super__Vector_base<rr::Fragment,_std::allocator<rr::Fragment>_>._M_impl.
  super__Vector_impl_data._M_start = pFVar11;
  shadedFragments.super__Vector_base<rr::Fragment,_std::allocator<rr::Fragment>_>._M_impl.
  super__Vector_impl_data._M_finish = pFVar12;
  shadedFragments.super__Vector_base<rr::Fragment,_std::allocator<rr::Fragment>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pFVar13;
  local_370 = (primList->super__Vector_base<rr::pa::Point,_std::allocator<rr::pa::Point>_>)._M_impl.
              super__Vector_impl_data._M_start;
  buffers.fragmentPackets.
  super__Vector_base<rr::FragmentPacket,_std::allocator<rr::FragmentPacket>_>._M_impl.
  super__Vector_impl_data._M_start = fragmentPackets;
  buffers.fragmentPackets.
  super__Vector_base<rr::FragmentPacket,_std::allocator<rr::FragmentPacket>_>._M_impl.
  super__Vector_impl_data._M_finish = pFVar1;
  buffers.fragmentPackets.
  super__Vector_base<rr::FragmentPacket,_std::allocator<rr::FragmentPacket>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pFVar1;
  buffers.fragmentDepthBuffer = fragmentDepths_;
  if (local_370 !=
      (primList->super__Vector_base<rr::pa::Point,_std::allocator<rr::pa::Point>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      iVar3 = *(int *)&local_368->field_0x8;
      fVar24 = (state->viewport).zn;
      fVar2 = (state->viewport).zf;
      TriangleRasterizer::TriangleRasterizer
                ((TriangleRasterizer *)&visiblePoints,&renderTargetRect,iVar3,&state->rasterization)
      ;
      TriangleRasterizer::TriangleRasterizer
                (&rasterizer2,&renderTargetRect,iVar3,&state->rasterization);
      pVVar7 = local_370->v0;
      fVar23 = pVVar7->pointSize * 0.5;
      w0.m_data[0] = (pVVar7->position).m_data[0] + fVar23;
      w0.m_data[1] = (pVVar7->position).m_data[1] + fVar23;
      w0.m_data[2] = (pVVar7->position).m_data[2];
      w0.m_data[3] = (pVVar7->position).m_data[3];
      w3.m_data[0] = (pVVar7->position).m_data[0] + fVar23;
      w3.m_data[1] = (pVVar7->position).m_data[1] - fVar23;
      w3.m_data[2] = w0.m_data[2];
      w3.m_data[3] = w0.m_data[3];
      TriangleRasterizer::init((TriangleRasterizer *)&visiblePoints,(EVP_PKEY_CTX *)&w0);
      TriangleRasterizer::init(&rasterizer2,(EVP_PKEY_CTX *)&w0);
      FragmentShadingContext::FragmentShadingContext
                (&shadingContext,local_370->v0->outputs,(GenericVec4 *)0x0,(GenericVec4 *)0x0,
                 outputArray_,fragmentDepths_,
                 (int)((ulong)((long)(program->fragmentShader->m_outputs).
                                     super__Vector_base<rr::FragmentOutputInfo,_std::allocator<rr::FragmentOutputInfo>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(program->fragmentShader->m_outputs).
                                    super__Vector_base<rr::FragmentOutputInfo,_std::allocator<rr::FragmentOutputInfo>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 2),iVar3,0,
                 in_stack_fffffffffffffc68);
      fVar23 = (float)(~-(uint)(fVar24 <= fVar2) & (uint)fVar2 |
                      -(uint)(fVar24 <= fVar2) & (uint)fVar24);
      fVar24 = (float)(~-(uint)(fVar2 <= fVar24) & (uint)fVar2 |
                      (uint)fVar24 & -(uint)(fVar2 <= fVar24));
      while( true ) {
        numRasterizedPackets = 0;
        TriangleRasterizer::rasterize
                  ((TriangleRasterizer *)&visiblePoints,fragmentPackets,fragmentDepths_,0x80,
                   &numRasterizedPackets);
        if ((long)numRasterizedPackets != 0x80) {
          depthValues = fragmentDepths_ + numRasterizedPackets * iVar3 * 4;
          if (fragmentDepths_ == (float *)0x0) {
            depthValues = (float *)0x0;
          }
          local_374 = 0;
          TriangleRasterizer::rasterize
                    (&rasterizer2,
                     buffers.fragmentPackets.
                     super__Vector_base<rr::FragmentPacket,_std::allocator<rr::FragmentPacket>_>.
                     _M_impl.super__Vector_impl_data._M_start + numRasterizedPackets,depthValues,
                     0x80 - numRasterizedPackets,&local_374);
          numRasterizedPackets = numRasterizedPackets + local_374;
        }
        if (numRasterizedPackets == 0) break;
        (**program->fragmentShader->_vptr_FragmentShader)(program->fragmentShader,fragmentPackets);
        if (((fragmentDepths_ != (float *)0x0) && ((state->fragOps).depthClampEnabled == true)) &&
           (uVar14 = numRasterizedPackets * iVar3 * 4, 0 < (int)uVar14)) {
          uVar21 = 0;
          do {
            fVar2 = fragmentDepths_[uVar21];
            fVar25 = fVar24;
            if (fVar2 <= fVar24) {
              fVar25 = fVar2;
            }
            uVar22 = -(uint)(fVar2 < fVar23);
            fragmentDepths_[uVar21] = (float)(uVar22 & (uint)fVar23 | ~uVar22 & (uint)fVar25);
            uVar21 = uVar21 + 1;
          } while (uVar14 != uVar21);
        }
        anon_unknown_19::writeFragmentPackets
                  (state,local_368,program,fragmentPackets,numRasterizedPackets,FACETYPE_FRONT,
                   &buffers.shaderOutputs,fragmentDepths_,&buffers.shadedFragments);
      }
      local_370 = local_370 + 1;
    } while (local_370 !=
             (primList->super__Vector_base<rr::pa::Point,_std::allocator<rr::pa::Point>_>)._M_impl.
             super__Vector_impl_data._M_finish);
  }
  if (buffers.shadedFragments.super__Vector_base<rr::Fragment,_std::allocator<rr::Fragment>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(buffers.shadedFragments.
                    super__Vector_base<rr::Fragment,_std::allocator<rr::Fragment>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)buffers.shadedFragments.
                          super__Vector_base<rr::Fragment,_std::allocator<rr::Fragment>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)buffers.shadedFragments.
                          super__Vector_base<rr::Fragment,_std::allocator<rr::Fragment>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (buffers.shaderOutputs.super__Vector_base<rr::GenericVec4,_std::allocator<rr::GenericVec4>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(buffers.shaderOutputs.
                    super__Vector_base<rr::GenericVec4,_std::allocator<rr::GenericVec4>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)buffers.shaderOutputs.
                          super__Vector_base<rr::GenericVec4,_std::allocator<rr::GenericVec4>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)buffers.shaderOutputs.
                          super__Vector_base<rr::GenericVec4,_std::allocator<rr::GenericVec4>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (buffers.fragmentPackets.
      super__Vector_base<rr::FragmentPacket,_std::allocator<rr::FragmentPacket>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(buffers.fragmentPackets.
                    super__Vector_base<rr::FragmentPacket,_std::allocator<rr::FragmentPacket>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)buffers.fragmentPackets.
                          super__Vector_base<rr::FragmentPacket,_std::allocator<rr::FragmentPacket>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)buffers.fragmentPackets.
                          super__Vector_base<rr::FragmentPacket,_std::allocator<rr::FragmentPacket>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_288.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (float *)0x0) {
    operator_delete(local_288.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_288.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_288.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (shadedFragments.super__Vector_base<rr::Fragment,_std::allocator<rr::Fragment>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(shadedFragments.super__Vector_base<rr::Fragment,_std::allocator<rr::Fragment>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)shadedFragments.
                          super__Vector_base<rr::Fragment,_std::allocator<rr::Fragment>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)shadedFragments.
                          super__Vector_base<rr::Fragment,_std::allocator<rr::Fragment>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (shaderOutputs.super__Vector_base<rr::GenericVec4,_std::allocator<rr::GenericVec4>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(shaderOutputs.
                    super__Vector_base<rr::GenericVec4,_std::allocator<rr::GenericVec4>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)shaderOutputs.
                          super__Vector_base<rr::GenericVec4,_std::allocator<rr::GenericVec4>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)shaderOutputs.
                          super__Vector_base<rr::GenericVec4,_std::allocator<rr::GenericVec4>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_380 != (pointer)0x0) {
    operator_delete(local_380,(long)local_388 - (long)local_380);
  }
  return;
}

Assistant:

void drawBasicPrimitives (const RenderState& state, const RenderTarget& renderTarget, const Program& program, ContainerType& primList, VertexPacketAllocator& vpalloc)
{
	const bool clipZ = !state.fragOps.depthClampEnabled;

	// Transform feedback

	// Flatshading
	flatshadeVertices(program, primList);

	// Clipping
	// \todo [jarkko] is creating & swapping std::vectors really a good solution?
	clipPrimitives(primList, program, clipZ, vpalloc);

	// Transform vertices to window coords
	transformClipCoordsToWindowCoords(state, primList);

	// Rasterize and paint
	rasterize(state, renderTarget, program, primList);
}